

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int translate_code(lemon *lemp,rule *rp)

{
  byte bVar1;
  symbol *psVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ushort **ppuVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  int local_820;
  int local_81c;
  int j;
  int dtnum;
  symbol *sp;
  char local_808 [7];
  char saved;
  char zOvwrt [900];
  char local_478 [8];
  char zLhs [50];
  char local_438 [8];
  char used [1000];
  char lhsdirect;
  char *pcStack_40;
  char lhsused;
  char *zSkip;
  uint local_30;
  int dontUseRhs0;
  int rc;
  int i;
  char *xp;
  char *cp;
  rule *rp_local;
  lemon *lemp_local;
  
  bVar3 = false;
  pcStack_40 = (char *)0x0;
  for (dontUseRhs0 = 0; dontUseRhs0 < rp->nrhs; dontUseRhs0 = dontUseRhs0 + 1) {
    local_438[dontUseRhs0] = '\0';
  }
  bVar4 = false;
  if (rp->code == (char *)0x0) {
    rp->code = translate_code::newlinestr;
    rp->line = rp->ruleline;
    rp->noCode = 1;
  }
  else {
    rp->noCode = 0;
  }
  if (rp->nrhs == 0) {
    bVar9 = true;
  }
  else if (*rp->rhsalias == (char *)0x0) {
    bVar9 = true;
    iVar5 = has_destructor(*rp->rhs,lemp);
    if (iVar5 != 0) {
      append_str((char *)0x0,0,0,0,0);
      append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n",0,(*rp->rhs)->index,
                 1 - rp->nrhs,0);
      pcVar8 = append_str((char *)0x0,0,0,0,0);
      pcVar8 = Strsafe(pcVar8);
      rp->codePrefix = pcVar8;
      rp->noCode = 0;
    }
  }
  else if (rp->lhsalias == (char *)0x0) {
    bVar9 = true;
  }
  else {
    iVar5 = strcmp(rp->lhsalias,*rp->rhsalias);
    if (iVar5 == 0) {
      bVar9 = true;
      bVar4 = true;
      local_438[0] = '\x01';
      if (rp->lhs->dtnum != (*rp->rhs)->dtnum) {
        ErrorMsg(lemp->filename,rp->ruleline,
                 "%s(%s) and %s(%s) share the same label but have different datatypes.",
                 rp->lhs->name,rp->lhsalias,(*rp->rhs)->name,*rp->rhsalias);
        lemp->errorcnt = lemp->errorcnt + 1;
      }
    }
    else {
      sprintf(local_808,"/*%s-overwrites-%s*/",rp->lhsalias,*rp->rhsalias);
      pcStack_40 = strstr(rp->code,local_808);
      bVar9 = pcStack_40 != (char *)0x0;
    }
  }
  if (!bVar9) {
    sprintf(local_478,"yylhsminor.yy%d",(ulong)(uint)rp->lhs->dtnum);
  }
  else {
    sprintf(local_478,"yymsp[%d].minor.yy%d",(ulong)(1 - rp->nrhs),(ulong)(uint)rp->lhs->dtnum);
  }
  local_30 = (uint)!bVar9;
  append_str((char *)0x0,0,0,0,0);
  xp = rp->code;
  do {
    if (*xp == '\0') {
      pcVar8 = append_str((char *)0x0,0,0,0,0);
      if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
        pcVar8 = Strsafe(pcVar8);
        rp->code = pcVar8;
      }
      append_str((char *)0x0,0,0,0,0);
      if ((rp->lhsalias != (char *)0x0) && (!bVar4)) {
        ErrorMsg(lemp->filename,rp->ruleline,"Label \"%s\" for \"%s(%s)\" is never used.",
                 rp->lhsalias,rp->lhs->name,rp->lhsalias);
        lemp->errorcnt = lemp->errorcnt + 1;
      }
      dontUseRhs0 = 0;
      do {
        if (rp->nrhs <= dontUseRhs0) {
          if (!bVar9) {
            append_str("  yymsp[%d].minor.yy%d = ",0,1 - rp->nrhs,rp->lhs->dtnum,0);
            append_str(local_478,0,0,0,0);
            append_str(";\n",0,0,0,0);
          }
          pcVar8 = append_str((char *)0x0,0,0,0,0);
          if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
            pcVar8 = Strsafe(pcVar8);
            rp->codeSuffix = pcVar8;
            rp->noCode = 0;
          }
          return local_30;
        }
        if (rp->rhsalias[dontUseRhs0] == (char *)0x0) {
          if ((0 < dontUseRhs0) && (iVar5 = has_destructor(rp->rhs[dontUseRhs0],lemp), iVar5 != 0))
          {
            append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n",0,
                       rp->rhs[dontUseRhs0]->index,(dontUseRhs0 - rp->nrhs) + 1,0);
          }
        }
        else {
          if (0 < dontUseRhs0) {
            if ((rp->lhsalias != (char *)0x0) &&
               (iVar5 = strcmp(rp->lhsalias,rp->rhsalias[dontUseRhs0]), iVar5 == 0)) {
              ErrorMsg(lemp->filename,rp->ruleline,
                       "%s(%s) has the same label as the LHS but is not the left-most symbol on the RHS."
                       ,rp->rhs[dontUseRhs0]->name);
              lemp->errorcnt = lemp->errorcnt + 1;
            }
            for (local_820 = 0; local_820 < dontUseRhs0; local_820 = local_820 + 1) {
              if ((rp->rhsalias[local_820] != (char *)0x0) &&
                 (iVar5 = strcmp(rp->rhsalias[local_820],rp->rhsalias[dontUseRhs0]), iVar5 == 0)) {
                ErrorMsg(lemp->filename,rp->ruleline,
                         "Label %s used for multiple symbols on the RHS of a rule.",
                         rp->rhsalias[dontUseRhs0]);
                lemp->errorcnt = lemp->errorcnt + 1;
                break;
              }
            }
          }
          if (local_438[dontUseRhs0] == '\0') {
            ErrorMsg(lemp->filename,rp->ruleline,"Label %s for \"%s(%s)\" is never used.",
                     rp->rhsalias[dontUseRhs0],rp->rhs[dontUseRhs0]->name,rp->rhsalias[dontUseRhs0])
            ;
            lemp->errorcnt = lemp->errorcnt + 1;
          }
        }
        dontUseRhs0 = dontUseRhs0 + 1;
      } while( true );
    }
    if (xp == pcStack_40) {
      append_str(local_808,0,0,0,0);
      sVar6 = strlen(local_808);
      xp = xp + ((int)sVar6 + -1);
      bVar3 = true;
    }
    else {
      ppuVar7 = __ctype_b_loc();
      if ((((*ppuVar7)[(int)(uint)(byte)*xp] & 0x400) != 0) &&
         ((_rc = (byte *)xp, xp == rp->code ||
          ((ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)(uint)(byte)xp[-1]] & 8) == 0 &&
           (xp[-1] != '_')))))) {
        do {
          _rc = _rc + 1;
          ppuVar7 = __ctype_b_loc();
          bVar10 = true;
          if (((*ppuVar7)[(int)(uint)*_rc] & 8) == 0) {
            bVar10 = *_rc == 0x5f;
          }
        } while (bVar10);
        bVar1 = *_rc;
        *_rc = 0;
        if ((rp->lhsalias == (char *)0x0) || (iVar5 = strcmp(xp,rp->lhsalias), iVar5 != 0)) {
          for (dontUseRhs0 = 0; dontUseRhs0 < rp->nrhs; dontUseRhs0 = dontUseRhs0 + 1) {
            if ((rp->rhsalias[dontUseRhs0] != (char *)0x0) &&
               (iVar5 = strcmp(xp,rp->rhsalias[dontUseRhs0]), iVar5 == 0)) {
              if ((dontUseRhs0 == 0) && (bVar3)) {
                ErrorMsg(lemp->filename,rp->ruleline,"Label %s used after \'%s\'.",*rp->rhsalias,
                         local_808);
                lemp->errorcnt = lemp->errorcnt + 1;
              }
              else if ((xp == rp->code) || (xp[-1] != '@')) {
                psVar2 = rp->rhs[dontUseRhs0];
                if (psVar2->type == MULTITERMINAL) {
                  local_81c = (*psVar2->subsym)->dtnum;
                }
                else {
                  local_81c = psVar2->dtnum;
                }
                append_str("yymsp[%d].minor.yy%d",0,(dontUseRhs0 - rp->nrhs) + 1,local_81c,0);
              }
              else {
                append_str("yymsp[%d].major",-1,(dontUseRhs0 - rp->nrhs) + 1,0,0);
              }
              xp = (char *)_rc;
              local_438[dontUseRhs0] = '\x01';
              break;
            }
          }
        }
        else {
          append_str(local_478,0,0,0,0);
          xp = (char *)_rc;
          bVar4 = true;
        }
        *_rc = bVar1;
      }
      append_str(xp,1,0,0,1);
    }
    xp = xp + 1;
  } while( true );
}

Assistant:

PRIVATE int translate_code(struct lemon *lemp, struct rule *rp){
  char *cp, *xp;
  int i;
  int rc = 0;            /* True if yylhsminor is used */
  int dontUseRhs0 = 0;   /* If true, use of left-most RHS label is illegal */
  const char *zSkip = 0; /* The zOvwrt comment within rp->code, or NULL */
  char lhsused = 0;      /* True if the LHS element has been used */
  char lhsdirect;        /* True if LHS writes directly into stack */
  char used[MAXRHS];     /* True for each RHS element which is used */
  char zLhs[50];         /* Convert the LHS symbol into this string */
  char zOvwrt[900];      /* Comment that to allow LHS to overwrite RHS */

  for(i=0; i<rp->nrhs; i++) used[i] = 0;
  lhsused = 0;

  if( rp->code==0 ){
    static char newlinestr[2] = { '\n', '\0' };
    rp->code = newlinestr;
    rp->line = rp->ruleline;
    rp->noCode = 1;
  }else{
    rp->noCode = 0;
  }

  if( rp->nrhs==0 ){
    /* If there are no RHS symbols, then writing directly to the LHS is ok */
    lhsdirect = 1;
  }else if( rp->rhsalias[0]==0 ){
    /* The left-most RHS symbol has not value.  LHS direct is ok.  But
    ** we have to call the distructor on the RHS symbol first. */
    lhsdirect = 1;
    if( has_destructor(rp->rhs[0],lemp) ){
      append_str(0,0,0,0,0);
      append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n", 0,
                 rp->rhs[0]->index,1-rp->nrhs,0);
      rp->codePrefix = Strsafe(append_str(0,0,0,0,0));
      rp->noCode = 0;
    }
  }else if( rp->lhsalias==0 ){
    /* There is no LHS value symbol. */
    lhsdirect = 1;
  }else if( strcmp(rp->lhsalias,rp->rhsalias[0])==0 ){
    /* The LHS symbol and the left-most RHS symbol are the same, so 
    ** direct writing is allowed */
    lhsdirect = 1;
    lhsused = 1;
    used[0] = 1;
    if( rp->lhs->dtnum!=rp->rhs[0]->dtnum ){
      ErrorMsg(lemp->filename,rp->ruleline,
        "%s(%s) and %s(%s) share the same label but have "
        "different datatypes.",
        rp->lhs->name, rp->lhsalias, rp->rhs[0]->name, rp->rhsalias[0]);
      lemp->errorcnt++;
    }
  }else{
    sprintf(zOvwrt, "/*%s-overwrites-%s*/", rp->lhsalias, rp->rhsalias[0]);
    zSkip = strstr(rp->code, zOvwrt);
    if( zSkip!=0 ){
      /* The code contains a special comment that indicates that it is safe
      ** for the LHS label to overwrite left-most RHS label. */
      lhsdirect = 1;
    }else{
      lhsdirect = 0;
    }
  }
  if( lhsdirect ){
    sprintf(zLhs, "yymsp[%d].minor.yy%d",1-rp->nrhs,rp->lhs->dtnum);
  }else{
    rc = 1;
    sprintf(zLhs, "yylhsminor.yy%d",rp->lhs->dtnum);
  }

  append_str(0,0,0,0,0);

  /* This const cast is wrong but harmless, if we're careful. */
  for(cp=(char *)rp->code; *cp; cp++){
    if( cp==zSkip ){
      append_str(zOvwrt,0,0,0,0);
      cp += lemonStrlen(zOvwrt)-1;
      dontUseRhs0 = 1;
      continue;
    }
    if( ISALPHA(*cp) && (cp==rp->code || (!ISALNUM(cp[-1]) && cp[-1]!='_')) ){
      char saved;
      for(xp= &cp[1]; ISALNUM(*xp) || *xp=='_'; xp++);
      saved = *xp;
      *xp = 0;
      if( rp->lhsalias && strcmp(cp,rp->lhsalias)==0 ){
        append_str(zLhs,0,0,0,0);
        cp = xp;
        lhsused = 1;
      }else{
        for(i=0; i<rp->nrhs; i++){
          if( rp->rhsalias[i] && strcmp(cp,rp->rhsalias[i])==0 ){
            if( i==0 && dontUseRhs0 ){
              ErrorMsg(lemp->filename,rp->ruleline,
                 "Label %s used after '%s'.",
                 rp->rhsalias[0], zOvwrt);
              lemp->errorcnt++;
            }else if( cp!=rp->code && cp[-1]=='@' ){
              /* If the argument is of the form @X then substituted
              ** the token number of X, not the value of X */
              append_str("yymsp[%d].major",-1,i-rp->nrhs+1,0,0);
            }else{
              struct symbol *sp = rp->rhs[i];
              int dtnum;
              if( sp->type==MULTITERMINAL ){
                dtnum = sp->subsym[0]->dtnum;
              }else{
                dtnum = sp->dtnum;
              }
              append_str("yymsp[%d].minor.yy%d",0,i-rp->nrhs+1, dtnum,0);
            }
            cp = xp;
            used[i] = 1;
            break;
          }
        }
      }
      *xp = saved;
    }
    append_str(cp, 1, 0, 0, 1);
  } /* End loop */

  /* Main code generation completed */
  cp = append_str(0,0,0,0,0);
  if( cp && cp[0] ) rp->code = Strsafe(cp);
  append_str(0,0,0,0,0);

  /* Check to make sure the LHS has been used */
  if( rp->lhsalias && !lhsused ){
    ErrorMsg(lemp->filename,rp->ruleline,
      "Label \"%s\" for \"%s(%s)\" is never used.",
        rp->lhsalias,rp->lhs->name,rp->lhsalias);
    lemp->errorcnt++;
  }

  /* Generate destructor code for RHS minor values which are not referenced.
  ** Generate error messages for unused labels and duplicate labels.
  */
  for(i=0; i<rp->nrhs; i++){
    if( rp->rhsalias[i] ){
      if( i>0 ){
        int j;
        if( rp->lhsalias && strcmp(rp->lhsalias,rp->rhsalias[i])==0 ){
          ErrorMsg(lemp->filename,rp->ruleline,
            "%s(%s) has the same label as the LHS but is not the left-most "
           "symbol on the RHS.",
            rp->rhs[i]->name, rp->rhsalias);
          lemp->errorcnt++;
        }
        for(j=0; j<i; j++){
          if( rp->rhsalias[j] && strcmp(rp->rhsalias[j],rp->rhsalias[i])==0 ){
            ErrorMsg(lemp->filename,rp->ruleline,
              "Label %s used for multiple symbols on the RHS of a rule.",
              rp->rhsalias[i]);
            lemp->errorcnt++;
            break;
          }
        }
      }
      if( !used[i] ){
        ErrorMsg(lemp->filename,rp->ruleline,
          "Label %s for \"%s(%s)\" is never used.",
          rp->rhsalias[i],rp->rhs[i]->name,rp->rhsalias[i]);
        lemp->errorcnt++;
      }
    }else if( i>0 && has_destructor(rp->rhs[i],lemp) ){
      append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n", 0,
         rp->rhs[i]->index,i-rp->nrhs+1,0);
    }
  }

  /* If unable to write LHS values directly into the stack, write the
  ** saved LHS value now. */
  if( lhsdirect==0 ){
    append_str("  yymsp[%d].minor.yy%d = ", 0, 1-rp->nrhs, rp->lhs->dtnum, 0);
    append_str(zLhs, 0, 0, 0, 0);
    append_str(";\n", 0, 0, 0, 0);
  }

  /* Suffix code generation complete */
  cp = append_str(0,0,0,0,0);
  if( cp && cp[0] ){
    rp->codeSuffix = Strsafe(cp);
    rp->noCode = 0;
  }

  return rc;
}